

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_cfg.c
# Opt level: O2

oonf_subsystem * oonf_cfg_load_subsystem(char *name)

{
  avl_node *paVar1;
  oonf_subsystem *subsystem;
  
  paVar1 = avl_find(&oonf_plugin_tree,name);
  if (paVar1 == (avl_node *)0x0) {
    subsystem = oonf_subsystem_load(name);
    if (subsystem == (oonf_subsystem *)0x0) {
      subsystem = (oonf_subsystem *)0x0;
    }
    else {
      oonf_subsystem_configure(&_oonf_schema,subsystem);
    }
  }
  else {
    subsystem = (oonf_subsystem *)(paVar1 + -2);
  }
  return subsystem;
}

Assistant:

struct oonf_subsystem *
oonf_cfg_load_subsystem(const char *name) {
  struct oonf_subsystem *plugin;

  plugin = oonf_subsystem_get(name);
  if (plugin) {
    /* already loaded */
    return plugin;
  }

  plugin = oonf_subsystem_load(name);
  if (plugin) {
    oonf_subsystem_configure(&_oonf_schema, plugin);
  }
  return plugin;
}